

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::CheckCompilerIdCompatibility(cmGlobalGenerator *this,cmMakefile *mf,string *lang)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  long *plVar6;
  char *__s1;
  ostream *poVar7;
  size_type *psVar8;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  PolicyID id_02;
  string compilerIdVar;
  ostringstream w;
  string local_1f0;
  ostream *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 "CMAKE_",lang);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_1a8);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1c8.field_2._M_allocated_capacity = *psVar8;
    local_1c8.field_2._8_8_ = plVar6[3];
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *psVar8;
    local_1c8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1c8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar1 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  __s1 = cmMakefile::GetDefinition(mf,&local_1c8);
  if (__s1 == (char *)0x0) goto LAB_0029e4a8;
  iVar4 = strcmp(__s1,"AppleClang");
  if (iVar4 == 0) {
    PVar5 = cmMakefile::GetPolicyStatus(mf,CMP0025);
    if (PVar5 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1a8,(cmPolicies *)0x19,id);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    else {
      if (PVar5 != OLD) {
        if (PVar5 != WARN) goto LAB_0029e491;
        bVar3 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (!bVar3) {
          local_1a8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"CMAKE_POLICY_WARNING_CMP0025","");
          cVar2 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)local_1a8);
          if ((pointer)local_1a8._0_8_ != pcVar1) {
            local_1d0 = (ostream *)CONCAT71(local_1d0._1_7_,cVar2);
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            cVar2 = (char)local_1d0;
          }
          if (cVar2 != '\0') {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x19,id_00);
            local_1d0 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,
                                   local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(local_1d0,"\nConverting ",0xc);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1d0,(lang->_M_dataplus)._M_p,lang->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7," compiler id \"AppleClang\" to \"Clang\" for compatibility.",0x37);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
        }
      }
      cmMakefile::AddDefinition(mf,&local_1c8,"Clang");
    }
  }
LAB_0029e491:
  iVar4 = strcmp(__s1,"QCC");
  if (iVar4 == 0) {
    PVar5 = cmMakefile::GetPolicyStatus(mf,CMP0047);
    if (PVar5 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1a8,(cmPolicies *)0x2f,id_01);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1a8);
    }
    else {
      if (PVar5 != OLD) {
        if (PVar5 != WARN) goto LAB_0029e4a8;
        bVar3 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (!bVar3) {
          local_1a8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"CMAKE_POLICY_WARNING_CMP0047","");
          bVar3 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)local_1a8);
          if ((pointer)local_1a8._0_8_ != pcVar1) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x2f,id_02);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,
                                local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\nConverting ",0xc);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(lang->_M_dataplus)._M_p,lang->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7," compiler id \"QCC\" to \"GNU\" for compatibility.",0x2e);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
        }
      }
      cmMakefile::AddDefinition(mf,&local_1c8,"GNU");
      iVar4 = std::__cxx11::string::compare((char *)lang);
      if (iVar4 == 0) {
        local_1a8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CMAKE_COMPILER_IS_GNUCC","");
        cmMakefile::AddDefinition(mf,(string *)local_1a8,"1");
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)lang);
        if (iVar4 != 0) goto LAB_0029e4a8;
        local_1a8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CMAKE_COMPILER_IS_GNUCXX","");
        cmMakefile::AddDefinition(mf,(string *)local_1a8,"1");
      }
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
LAB_0029e4a8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CheckCompilerIdCompatibility(cmMakefile* mf,
                                                std::string const& lang) const
{
  std::string compilerIdVar = "CMAKE_" + lang + "_COMPILER_ID";
  const char* compilerId = mf->GetDefinition(compilerIdVar);
  if(!compilerId)
    {
    return;
    }

  if(strcmp(compilerId, "AppleClang") == 0)
    {
    switch(mf->GetPolicyStatus(cmPolicies::CMP0025))
      {
      case cmPolicies::WARN:
        if(!this->CMakeInstance->GetIsInTryCompile() &&
           mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0025"))
          {
          std::ostringstream w;
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0025) << "\n"
            "Converting " << lang <<
            " compiler id \"AppleClang\" to \"Clang\" for compatibility."
            ;
          mf->IssueMessage(cmake::AUTHOR_WARNING, w.str());
          }
      case cmPolicies::OLD:
        // OLD behavior is to convert AppleClang to Clang.
        mf->AddDefinition(compilerIdVar, "Clang");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0025)
          );
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
      }
    }

  if(strcmp(compilerId, "QCC") == 0)
    {
    switch(mf->GetPolicyStatus(cmPolicies::CMP0047))
      {
      case cmPolicies::WARN:
        if(!this->CMakeInstance->GetIsInTryCompile() &&
           mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0047"))
          {
          std::ostringstream w;
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0047) << "\n"
            "Converting " << lang <<
            " compiler id \"QCC\" to \"GNU\" for compatibility."
            ;
          mf->IssueMessage(cmake::AUTHOR_WARNING, w.str());
          }
      case cmPolicies::OLD:
        // OLD behavior is to convert QCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if(lang == "C")
          {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
          }
        else if(lang == "CXX")
          {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
          }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0047)
          );
      case cmPolicies::NEW:
        // NEW behavior is to keep QCC.
        break;
      }
    }
}